

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
          (internal *this,char *expected_expression,char *actual_expression,pair<int,_int> *expected
          ,pair<int,_int> *actual)

{
  undefined4 in_EAX;
  pair<int,_int> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  AssertionResult AVar5;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  iVar3 = -(uint)((*actual).first == (*expected).first);
  iVar4 = -(uint)((*actual).second == (*expected).second);
  auVar2._4_4_ = iVar3;
  auVar2._0_4_ = iVar3;
  auVar2._8_4_ = iVar4;
  auVar2._12_4_ = iVar4;
  iVar3 = movmskpd(in_EAX,auVar2);
  if (iVar3 == 3) {
    AVar5 = AssertionSuccess();
    sVar1 = AVar5.message_.ptr_;
  }
  else {
    PrintToString<std::pair<int,int>>
              (&local_40,(testing *)expected,(pair<int,_int> *)actual_expression);
    PrintToString<std::pair<int,int>>(&local_60,(testing *)actual,value);
    EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar5.message_.ptr_ = sVar1.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}